

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

uint64_t BitsEntropyRefine(VP8LBitEntropy *entropy)

{
  uint64_t uVar1;
  ulong *in_RDI;
  uint64_t min_limit;
  uint64_t mix;
  ulong local_28;
  long local_18;
  
  if (*(int *)((long)in_RDI + 0xc) < 5) {
    if (*(int *)((long)in_RDI + 0xc) < 2) {
      return 0;
    }
    if (*(int *)((long)in_RDI + 0xc) == 2) {
      uVar1 = DivRound((ulong)(uint)in_RDI[1] * 0x31800000 + *in_RDI,100);
      return uVar1;
    }
    if (*(int *)((long)in_RDI + 0xc) == 3) {
      local_18 = 0x3b6;
    }
    else {
      local_18 = 700;
    }
  }
  else {
    local_18 = 0x273;
  }
  local_28 = DivRound(local_18 * (ulong)(uint)((int)in_RDI[1] * 2 - (int)in_RDI[2]) * 0x800000 +
                      (1000 - local_18) * *in_RDI,1000);
  if (local_28 <= *in_RDI) {
    local_28 = *in_RDI;
  }
  return local_28;
}

Assistant:

static WEBP_INLINE uint64_t BitsEntropyRefine(const VP8LBitEntropy* entropy) {
  uint64_t mix;
  if (entropy->nonzeros < 5) {
    if (entropy->nonzeros <= 1) {
      return 0;
    }
    // Two symbols, they will be 0 and 1 in a Huffman code.
    // Let's mix in a bit of entropy to favor good clustering when
    // distributions of these are combined.
    if (entropy->nonzeros == 2) {
      return DivRound(99 * ((uint64_t)entropy->sum << LOG_2_PRECISION_BITS) +
                          entropy->entropy,
                      100);
    }
    // No matter what the entropy says, we cannot be better than min_limit
    // with Huffman coding. I am mixing a bit of entropy into the
    // min_limit since it produces much better (~0.5 %) compression results
    // perhaps because of better entropy clustering.
    if (entropy->nonzeros == 3) {
      mix = 950;
    } else {
      mix = 700;  // nonzeros == 4.
    }
  } else {
    mix = 627;
  }

  {
    uint64_t min_limit = (uint64_t)(2 * entropy->sum - entropy->max_val)
                         << LOG_2_PRECISION_BITS;
    min_limit =
        DivRound(mix * min_limit + (1000 - mix) * entropy->entropy, 1000);
    return (entropy->entropy < min_limit) ? min_limit : entropy->entropy;
  }
}